

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFPSCounter.cpp
# Opt level: O2

void __thiscall
irr::video::CFPSCounter::registerFrame(CFPSCounter *this,u32 now,u32 primitivesDrawn)

{
  u32 uVar1;
  uint uVar2;
  u32 uVar3;
  float fVar4;
  float fVar5;
  
  uVar1 = this->FramesCounted + 1;
  this->FramesCounted = uVar1;
  this->PrimitiveTotal = this->PrimitiveTotal + primitivesDrawn;
  uVar3 = this->PrimitivesCounted + primitivesDrawn;
  this->PrimitivesCounted = uVar3;
  this->Primitive = primitivesDrawn;
  uVar2 = now - this->StartTime;
  if (0x5db < uVar2) {
    fVar5 = 1.0 / (float)uVar2;
    fVar4 = ceilf((float)(uVar1 * 1000) * fVar5);
    this->FPS = (int)fVar4;
    fVar4 = ceilf((float)(uVar3 * 1000) * fVar5);
    this->PrimitiveAverage = (int)fVar4;
    this->FramesCounted = 0;
    this->PrimitivesCounted = 0;
    this->StartTime = now;
  }
  return;
}

Assistant:

void CFPSCounter::registerFrame(u32 now, u32 primitivesDrawn)
{
	++FramesCounted;
	PrimitiveTotal += primitivesDrawn;
	PrimitivesCounted += primitivesDrawn;
	Primitive = primitivesDrawn;

	const u32 milliseconds = now - StartTime;

	if (milliseconds >= 1500) {
		const f32 invMilli = core::reciprocal((f32)milliseconds);

		FPS = core::ceil32((1000 * FramesCounted) * invMilli);
		PrimitiveAverage = core::ceil32((1000 * PrimitivesCounted) * invMilli);

		FramesCounted = 0;
		PrimitivesCounted = 0;
		StartTime = now;
	}
}